

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

bool __thiscall
cmFindLibraryHelper::CheckDirectoryForName(cmFindLibraryHelper *this,string *path,Name *name)

{
  bool bVar1;
  byte bVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type sVar3;
  undefined8 uVar4;
  ulong uVar5;
  string local_1a0;
  uint local_180;
  uint local_17c;
  uint minor;
  uint major;
  size_type local_158;
  size_type suffix;
  size_type local_130;
  size_type prefix;
  string local_108;
  reference local_e8;
  string *testName;
  string *origName;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  string dir;
  uint bestMinor;
  uint bestMajor;
  size_type bestSuffix;
  size_type bestPrefix;
  undefined1 local_70 [8];
  string testPath;
  undefined1 local_48 [7];
  bool exists;
  Name *local_28;
  Name *name_local;
  string *path_local;
  cmFindLibraryHelper *this_local;
  
  local_28 = name;
  name_local = (Name *)path;
  path_local = (string *)this;
  if ((name->TryRaw & 1U) != 0) {
    cmStrCat<std::__cxx11::string_const&,std::__cxx11::string&>((string *)local_48,path,&name->Raw);
    std::__cxx11::string::operator=((string *)&this->TestPath,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
    testPath.field_2._M_local_buf[0xf] = cmsys::SystemTools::FileExists(&this->TestPath,true);
    if ((bool)testPath.field_2._M_local_buf[0xf]) {
      cmsys::SystemTools::CollapseFullPath((string *)local_70,&this->TestPath);
      bVar1 = Validate(this,(string *)local_70);
      if (bVar1) {
        DebugLibraryFound(this,&local_28->Raw,(string *)name_local);
        std::__cxx11::string::operator=((string *)&this->BestPath,(string *)local_70);
        this_local._7_1_ = 1;
      }
      else {
        DebugLibraryFailed(this,&local_28->Raw,(string *)name_local);
      }
      std::__cxx11::string::~string((string *)local_70);
      if (bVar1) goto LAB_00321666;
    }
    else {
      DebugLibraryFailed(this,&local_28->Raw,(string *)name_local);
    }
  }
  bestSuffix = cmList::size(&this->Prefixes);
  _bestMinor = cmList::size(&this->Suffixes);
  dir.field_2._12_4_ = 0;
  dir.field_2._8_4_ = 0;
  std::__cxx11::string::string((string *)&files,(string *)name_local);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)&files);
  this_00 = cmGlobalGenerator::GetDirectoryContent(this->GG,(string *)&files,true);
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  origName = (string *)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(this_00);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&origName), bVar1) {
    local_e8 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
    testName = local_e8;
    bVar1 = cmsys::RegularExpression::find(&local_28->Regex,local_e8);
    if (bVar1) {
      cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&>
                (&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name_local,
                 testName);
      std::__cxx11::string::operator=((string *)&this->TestPath,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      bVar1 = cmsys::SystemTools::FileExists(&this->TestPath,true);
      if (bVar1) {
        cmsys::SystemTools::CollapseFullPath((string *)&prefix,&this->TestPath);
        bVar1 = Validate(this,(string *)&prefix);
        std::__cxx11::string::~string((string *)&prefix);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          DebugLibraryFound(this,&local_28->Raw,(string *)&files);
          cmsys::RegularExpression::match_abi_cxx11_((string *)&suffix,&local_28->Regex,1);
          sVar3 = GetPrefixIndex(this,(string *)&suffix);
          std::__cxx11::string::~string((string *)&suffix);
          local_130 = sVar3;
          cmsys::RegularExpression::match_abi_cxx11_((string *)&minor,&local_28->Regex,2);
          sVar3 = GetSuffixIndex(this,(string *)&minor);
          std::__cxx11::string::~string((string *)&minor);
          local_17c = 0;
          local_180 = 0;
          local_158 = sVar3;
          if ((this->IsOpenBSD & 1U) != 0) {
            cmsys::RegularExpression::match_abi_cxx11_(&local_1a0,&local_28->Regex,3);
            uVar4 = std::__cxx11::string::c_str();
            __isoc99_sscanf(uVar4,".%u.%u",&local_17c,&local_180);
            std::__cxx11::string::~string((string *)&local_1a0);
          }
          uVar5 = std::__cxx11::string::empty();
          if (((((uVar5 & 1) != 0) || (local_130 < bestSuffix)) ||
              ((local_130 == bestSuffix && (local_158 < _bestMinor)))) ||
             (((local_130 == bestSuffix && (local_158 == _bestMinor)) &&
              (((uint)dir.field_2._12_4_ < local_17c ||
               ((local_17c == dir.field_2._12_4_ && ((uint)dir.field_2._8_4_ < local_180)))))))) {
            std::__cxx11::string::operator=((string *)&this->BestPath,(string *)&this->TestPath);
            bestSuffix = local_130;
            _bestMinor = local_158;
            dir.field_2._12_4_ = local_17c;
            dir.field_2._8_4_ = local_180;
          }
        }
      }
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    DebugLibraryFound(this,&local_28->Raw,&this->BestPath);
  }
  else {
    DebugLibraryFailed(this,&local_28->Raw,(string *)&files);
  }
  bVar2 = std::__cxx11::string::empty();
  this_local._7_1_ = (bVar2 ^ 0xff) & 1;
  std::__cxx11::string::~string((string *)&files);
LAB_00321666:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFindLibraryHelper::CheckDirectoryForName(std::string const& path,
                                                Name& name)
{
  // If the original library name provided by the user matches one of
  // the suffixes, try it first.  This allows users to search
  // specifically for a static library on some platforms (on MS tools
  // one cannot tell just from the library name whether it is a static
  // library or an import library).
  if (name.TryRaw) {
    this->TestPath = cmStrCat(path, name.Raw);

    const bool exists = cmSystemTools::FileExists(this->TestPath, true);
    if (!exists) {
      this->DebugLibraryFailed(name.Raw, path);
    } else {
      auto testPath = cmSystemTools::CollapseFullPath(this->TestPath);
      if (this->Validate(testPath)) {
        this->DebugLibraryFound(name.Raw, path);
        this->BestPath = testPath;
        return true;
      }
      this->DebugLibraryFailed(name.Raw, path);
    }
  }

  // No library file has yet been found.
  size_type bestPrefix = this->Prefixes.size();
  size_type bestSuffix = this->Suffixes.size();
  unsigned int bestMajor = 0;
  unsigned int bestMinor = 0;

  // Search for a file matching the library name regex.
  std::string dir = path;
  cmSystemTools::ConvertToUnixSlashes(dir);
  std::set<std::string> const& files = this->GG->GetDirectoryContent(dir);
  for (std::string const& origName : files) {
#if defined(_WIN32) || defined(__APPLE__)
    std::string testName = cmSystemTools::LowerCase(origName);
#else
    std::string const& testName = origName;
#endif
    if (name.Regex.find(testName)) {
      this->TestPath = cmStrCat(path, origName);
      // Make sure the path is readable and is not a directory.
      if (cmSystemTools::FileExists(this->TestPath, true)) {
        if (!this->Validate(cmSystemTools::CollapseFullPath(this->TestPath))) {
          continue;
        }

        this->DebugLibraryFound(name.Raw, dir);
        // This is a matching file.  Check if it is better than the
        // best name found so far.  Earlier prefixes are preferred,
        // followed by earlier suffixes.  For OpenBSD, shared library
        // version extensions are compared.
        size_type prefix = this->GetPrefixIndex(name.Regex.match(1));
        size_type suffix = this->GetSuffixIndex(name.Regex.match(2));
        unsigned int major = 0;
        unsigned int minor = 0;
        if (this->IsOpenBSD) {
          sscanf(name.Regex.match(3).c_str(), ".%u.%u", &major, &minor);
        }
        if (this->BestPath.empty() || prefix < bestPrefix ||
            (prefix == bestPrefix && suffix < bestSuffix) ||
            (prefix == bestPrefix && suffix == bestSuffix &&
             (major > bestMajor ||
              (major == bestMajor && minor > bestMinor)))) {
          this->BestPath = this->TestPath;
          bestPrefix = prefix;
          bestSuffix = suffix;
          bestMajor = major;
          bestMinor = minor;
        }
      }
    }
  }

  if (this->BestPath.empty()) {
    this->DebugLibraryFailed(name.Raw, dir);
  } else {
    this->DebugLibraryFound(name.Raw, this->BestPath);
  }

  // Use the best candidate found in this directory, if any.
  return !this->BestPath.empty();
}